

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O2

ArrayPtr<const_capnp::word> __thiscall
capnp::InputStreamMessageReader::getSegment(InputStreamMessageReader *this,uint id)

{
  ulong uVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  word *pwVar3;
  ssize_t sVar4;
  ArrayPtr<const_capnp::word> *pAVar5;
  word *pwVar6;
  size_t sVar7;
  ArrayPtr<const_capnp::word> AVar8;
  
  uVar1 = (this->moreSegments).size_;
  pwVar6 = (word *)0x0;
  sVar7 = 0;
  if (id <= uVar1) {
    pAVar2 = (this->moreSegments).ptr;
    pAVar5 = pAVar2 + (id - 1);
    if (id == 0) {
      pAVar5 = &this->segment0;
    }
    pwVar3 = (word *)this->readPos;
    pwVar6 = pAVar5->ptr;
    sVar7 = pAVar5->size_;
    if ((pwVar3 != (word *)0x0) && (pwVar3 < pwVar6 + sVar7)) {
      sVar4 = kj::InputStream::read
                        (this->inputStream,(int)pwVar3,
                         (void *)((long)(pwVar6 + sVar7) - (long)pwVar3),
                         (long)pAVar2[uVar1 - 1].ptr + (pAVar2[uVar1 - 1].size_ * 8 - (long)pwVar3))
      ;
      this->readPos = this->readPos + sVar4;
    }
  }
  AVar8.size_ = sVar7;
  AVar8.ptr = pwVar6;
  return AVar8;
}

Assistant:

kj::ArrayPtr<const word> InputStreamMessageReader::getSegment(uint id) {
  if (id > moreSegments.size()) {
    return nullptr;
  }

  kj::ArrayPtr<const word> segment = id == 0 ? segment0 : moreSegments[id - 1];

  if (readPos != nullptr) {
    // May need to lazily read more data.
    const byte* segmentEnd = reinterpret_cast<const byte*>(segment.end());
    if (readPos < segmentEnd) {
      // Note that lazy reads only happen when we have multiple segments, so moreSegments.back() is
      // valid.
      const byte* allEnd = reinterpret_cast<const byte*>(moreSegments.back().end());
      readPos += inputStream.read(readPos, segmentEnd - readPos, allEnd - readPos);
    }
  }

  return segment;
}